

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

void Abc_NtkRecAdd3(Abc_Ntk_t *pNtk,int fUseSOPB)

{
  Gia_Man_t *p;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  long lVar2;
  Lms_Man_t *pLVar3;
  long lVar4;
  timespec ts_1;
  If_Par_t Pars;
  timespec local_168;
  If_Par_t local_158;
  
  iVar1 = clock_gettime(3,(timespec *)&local_158);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = (long)(((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816((long)local_158._8_8_),8) >>
                         7) -
                   (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816((long)local_158._8_8_),0xc) >> 0x1f
                   )) + local_158.nLutSize * 1000000);
  }
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    puts("Performing recoding structures with choices.");
  }
  pLVar3 = s_pMan3;
  s_pMan3->fLibConstr = 1;
  p = pLVar3->pGia;
  if ((p != (Gia_Man_t *)0x0) && (p->pHTable == (int *)0x0)) {
    Gia_ManHashStart(p);
    pLVar3 = s_pMan3;
  }
  memset(&local_158.nFlowIters,0,0x128);
  local_158.nLutSize = pLVar3->nVars;
  local_158.nCutsMax = pLVar3->nCuts;
  local_158.DelayTarget = -1.0;
  local_158.Epsilon = 0.005;
  local_158.fArea = 1;
  local_158.fTruth = 1;
  local_158.fCutMin = (int)(fUseSOPB == 0);
  local_158.fDelayOpt = (int)(fUseSOPB != 0);
  local_158.pFuncCost = (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0;
  local_158.pFuncUser = Abc_NtkRecAddCut3;
  local_158.fUsePerm = local_158.fDelayOpt;
  pNtk_00 = Abc_NtkIf(pNtk,&local_158);
  Abc_NtkDelete(pNtk_00);
  iVar1 = clock_gettime(3,&local_168);
  if (iVar1 < 0) {
    lVar2 = -1;
  }
  else {
    lVar2 = local_168.tv_nsec / 1000 + local_168.tv_sec * 1000000;
  }
  s_pMan3->timeTotal = s_pMan3->timeTotal + (lVar2 - lVar4);
  return;
}

Assistant:

void Abc_NtkRecAdd3( Abc_Ntk_t * pNtk, int fUseSOPB )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    If_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkNew;
    int clk = Abc_Clock();
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing recoding structures with choices.\n" );
    // remember that the manager was used for library construction
    s_pMan3->fLibConstr = 1;
    // create hash table if not available
    if ( s_pMan3->pGia && s_pMan3->pGia->pHTable == NULL )
        Gia_ManHashStart( s_pMan3->pGia );

    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  s_pMan3->nVars;
    pPars->nCutsMax    =  s_pMan3->nCuts;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fArea       =  1;
    // internal parameters
    if ( fUseSOPB )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  0;
        pPars->fUsePerm    =  1; 
        pPars->fDelayOpt   =  1;
    }
    else
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fUsePerm    =  0; 
        pPars->fDelayOpt   =  0;
    }
    pPars->fSkipCutFilter = 0;
    pPars->pFuncCost   =  NULL;
    pPars->pFuncUser   =  Abc_NtkRecAddCut3;
    // perform recording
    pNtkNew = Abc_NtkIf( pNtk, pPars );
    Abc_NtkDelete( pNtkNew );
s_pMan3->timeTotal += Abc_Clock() - clk;
}